

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControlLabel::ControlLabel(ControlLabel *this,QWidget *parent)

{
  long lVar1;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  FocusPolicy in_stack_ffffffffffffffac;
  QWidget *in_stack_ffffffffffffffb8;
  QWidget *pQVar2;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RSI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x62a726);
  QWidget::QWidget(in_RDI,in_stack_ffffffffffffffb8,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)pQVar2 >> 0x20,0));
  *(undefined ***)in_RDI = &PTR_metaObject_00d16e30;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__ControlLabel_00d16fe0;
  pQVar2 = in_RDI + 1;
  QPixmap::QPixmap((QPixmap *)pQVar2);
  in_RDI[1].field_0x18 = 0;
  QWidget::setFocusPolicy(in_RSI,in_stack_ffffffffffffffac);
  updateWindowIcon((ControlLabel *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  QPixmap::deviceIndependentSize();
  QSizeF::toSize((QSizeF *)in_RDI);
  QWidget::setFixedSize(in_RDI,(QSize *)pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ControlLabel::ControlLabel(QWidget *parent)
    : QWidget(parent), isPressed(false)
{
    setFocusPolicy(Qt::NoFocus);
    updateWindowIcon();
    setFixedSize(label.deviceIndependentSize().toSize());
}